

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdecompresshelper.cpp
# Opt level: O2

bool __thiscall QDecompressHelper::countInternal(QDecompressHelper *this)

{
  bool bVar1;
  QDecompressHelper *this_00;
  char *data;
  qsizetype qVar2;
  ssize_t sVar3;
  size_t in_RCX;
  byte bVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  array<char,_1024UL> temp;
  QArrayDataPointer<char> local_438 [43];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    if (((this->compressedDataBuffer).bufferCompleteSize == 0) && ((this->decoderHasData & 1U) == 0)
       ) {
      bVar4 = 1;
      goto LAB_001d2882;
    }
    if (this->MaxDecompressedDataBufferSize <= (this->decompressedDataBuffer).bufferCompleteSize)
    goto LAB_001d2828;
    local_438[0].size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_438[0].d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_438[0].ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)local_438,0x40000,Uninitialized);
    data = QByteArray::data((QByteArray *)local_438);
    qVar2 = readInternal(this,data,local_438[0].size);
    if (qVar2 == -1) break;
    QByteArray::truncate((longlong)local_438);
    QByteDataBuffer::append(&this->decompressedDataBuffer,(QByteArray *)local_438);
    QArrayDataPointer<char>::~QArrayDataPointer(local_438);
  }
  QArrayDataPointer<char>::~QArrayDataPointer(local_438);
  bVar4 = 0;
  goto LAB_001d2882;
  while( true ) {
    memset(local_438,0xaa,0x400);
    sVar3 = read(this_00,(int)local_438,(void *)0x400,in_RCX);
    if (sVar3 == -1) break;
LAB_001d2828:
    this_00 = (this->countHelper)._M_t.
              super___uniq_ptr_impl<QDecompressHelper,_std::default_delete<QDecompressHelper>_>._M_t
              .super__Tuple_impl<0UL,_QDecompressHelper_*,_std::default_delete<QDecompressHelper>_>.
              super__Head_base<0UL,_QDecompressHelper_*,_false>._M_head_impl;
    bVar5 = (this_00->compressedDataBuffer).bufferCompleteSize != 0;
    bVar1 = this_00->decoderHasData;
    bVar6 = (this_00->decompressedDataBuffer).bufferCompleteSize != 0;
    if (!bVar6 && (!bVar5 && (bVar1 & 1U) == 0)) break;
  }
  bVar4 = (bVar6 | bVar5 | bVar1) ^ 1;
LAB_001d2882:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (bool)(bVar4 & 1);
}

Assistant:

bool QDecompressHelper::countInternal()
{
    Q_ASSERT(countDecompressed);
    while (hasDataInternal()
           && decompressedDataBuffer.byteAmount() < MaxDecompressedDataBufferSize) {
        const qsizetype toRead = 256 * 1024;
        QByteArray buffer(toRead, Qt::Uninitialized);
        qsizetype bytesRead = readInternal(buffer.data(), buffer.size());
        if (bytesRead == -1)
            return false;
        buffer.truncate(bytesRead);
        decompressedDataBuffer.append(std::move(buffer));
    }
    if (!hasDataInternal())
        return true; // handled all the data so far, just return

    while (countHelper->hasData()) {
        std::array<char, 1024> temp;
        qsizetype bytesRead = countHelper->read(temp.data(), temp.size());
        if (bytesRead == -1)
            return false;
    }
    return true;
}